

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O3

void set_modflag(int mf)

{
  char *pcVar1;
  char *pcVar2;
  char *name;
  Fl_Window *this;
  
  this = main_window;
  pcVar1 = filename;
  modflag = mf;
  if (main_window != (Fl_Window *)0x0) {
    if (filename == (char *)0x0) {
      name = "Untitled.fl";
    }
    else {
      pcVar2 = strrchr(filename,0x2f);
      name = pcVar2 + 1;
      if (pcVar2 == (char *)0x0) {
        name = pcVar1;
      }
    }
    if (mf != 0) {
      snprintf(set_modflag::title,0x800,"%s (modified)");
      name = set_modflag::title;
      this = main_window;
    }
    Fl_Window::label(this,name);
  }
  if (((sourceview_panel != (Fl_Double_Window *)0x0) &&
      (((sourceview_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget.flags_ & 2) == 0)) &&
     ((sv_autorefresh->super_Fl_Button).value_ != '\0')) {
    Fl::remove_timeout(update_sourceview_timer,(void *)0x0);
    Fl::add_timeout(0.5,update_sourceview_timer,(void *)0x0);
  }
  save_item->flags = (uint)(modflag == 0) | save_item->flags & 0xfffffffeU;
  return;
}

Assistant:

void set_modflag(int mf) {
  const char	*basename;
  static char	title[FL_PATH_MAX];

  modflag = mf;

  if (main_window) {
    if (!filename) basename = "Untitled.fl";
    else if ((basename = strrchr(filename, '/')) != NULL) basename ++;
#if defined(WIN32) || defined(__EMX__)
    else if ((basename = strrchr(filename, '\\')) != NULL) basename ++;
#endif // WIN32 || __EMX__
    else basename = filename;

    if (modflag) {
      snprintf(title, sizeof(title), "%s (modified)", basename);
      main_window->label(title);
    } else main_window->label(basename);
  }
  // if the UI was modified in any way, update the Source View panel
  if (sourceview_panel && sourceview_panel->visible() && sv_autorefresh->value())
  {
    // we will only update earliest 0.5 seconds after the last change, and only
    // if no other change was made, so dragging a widget will not generate any
    // CPU load
    Fl::remove_timeout(update_sourceview_timer, 0);
    Fl::add_timeout(0.5, update_sourceview_timer, 0);
  }

  // Enable/disable the Save menu item...
  if (modflag) save_item->activate();
  else save_item->deactivate();
}